

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O0

pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> * __thiscall
spvtools::EnumSet<spv::Capability>::insert
          (pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> *__return_storage_ptr__,
          EnumSet<spv::Capability> *this,Capability *value)

{
  Capability CVar1;
  ulong uVar2;
  Capability CVar3;
  size_type sVar4;
  reference pvVar5;
  BucketType BVar6;
  bool local_99;
  Iterator local_98;
  bool local_79;
  Iterator local_78;
  BucketType local_60;
  BucketType mask;
  value_type *bucket;
  Iterator local_48;
  ElementType local_2c;
  size_t sStack_28;
  ElementType offset;
  size_t index;
  Capability *value_local;
  EnumSet<spv::Capability> *this_local;
  
  index = (size_t)value;
  value_local = (Capability *)this;
  this_local = (EnumSet<spv::Capability> *)__return_storage_ptr__;
  sStack_28 = FindBucketForValue(this,*value);
  local_2c = ComputeBucketOffset(*(Capability *)index);
  uVar2 = sStack_28;
  sVar4 = std::
          vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
          ::size(&this->buckets_);
  if (uVar2 < sVar4) {
    pvVar5 = std::
             vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
             ::operator[](&this->buckets_,sStack_28);
    CVar1 = pvVar5->start;
    CVar3 = ComputeBucketStart(*(Capability *)index);
    if (CVar1 == CVar3) {
      mask = (BucketType)
             std::
             vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
             ::operator[](&this->buckets_,sStack_28);
      local_60 = ComputeMaskForValue(*(Capability *)index);
      if ((*(ulong *)mask & local_60) != 0) {
        Iterator::Iterator(&local_78,this,sStack_28,local_2c);
        local_79 = false;
        std::make_pair<spvtools::EnumSet<spv::Capability>::Iterator,bool>
                  (__return_storage_ptr__,&local_78,&local_79);
        return __return_storage_ptr__;
      }
      this->size_ = this->size_ + 1;
      BVar6 = ComputeMaskForValue(*(Capability *)index);
      *(BucketType *)mask = BVar6 | *(ulong *)mask;
      Iterator::Iterator(&local_98,this,sStack_28,local_2c);
      local_99 = true;
      std::make_pair<spvtools::EnumSet<spv::Capability>::Iterator,bool>
                (__return_storage_ptr__,&local_98,&local_99);
      return __return_storage_ptr__;
    }
  }
  this->size_ = this->size_ + 1;
  InsertBucketFor(this,sStack_28,*(Capability *)index);
  Iterator::Iterator(&local_48,this,sStack_28,local_2c);
  bucket._7_1_ = 1;
  std::make_pair<spvtools::EnumSet<spv::Capability>::Iterator,bool>
            (__return_storage_ptr__,&local_48,(bool *)((long)&bucket + 7));
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(const T& value) {
    const size_t index = FindBucketForValue(value);
    const ElementType offset = ComputeBucketOffset(value);

    if (index >= buckets_.size() ||
        buckets_[index].start != ComputeBucketStart(value)) {
      size_ += 1;
      InsertBucketFor(index, value);
      return std::make_pair(Iterator(this, index, offset), true);
    }

    auto& bucket = buckets_[index];
    const auto mask = ComputeMaskForValue(value);
    if (bucket.data & mask) {
      return std::make_pair(Iterator(this, index, offset), false);
    }

    size_ += 1;
    bucket.data |= ComputeMaskForValue(value);
    return std::make_pair(Iterator(this, index, offset), true);
  }